

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHuf.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::sendCode
               (Int64 sCode,int runCount,Int64 runCode,Int64 *c,int *lc,char **out)

{
  int *lc_00;
  Int64 IVar1;
  Int64 *c_00;
  Int64 *in_RCX;
  Int64 in_RDX;
  int in_ESI;
  Int64 in_RDI;
  int *in_R8;
  char **in_R9;
  char **in_stack_ffffffffffffffb8;
  int local_c;
  
  lc_00 = (int *)hufLength(in_RDI);
  IVar1 = hufLength(in_RDX);
  c_00 = (Int64 *)((long)lc_00 + IVar1 + 8);
  IVar1 = hufLength(in_RDI);
  local_c = in_ESI;
  if (c_00 < (Int64 *)(IVar1 * (long)in_ESI)) {
    outputCode((Int64)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputCode((Int64)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
    outputBits(8,(long)in_ESI,in_RCX,in_R8,in_R9);
  }
  else {
    while (-1 < local_c) {
      outputCode((Int64)in_R9,c_00,lc_00,in_stack_ffffffffffffffb8);
      local_c = local_c + -1;
    }
  }
  return;
}

Assistant:

inline void
sendCode (Int64 sCode, int runCount, Int64 runCode,
	  Int64 &c, int &lc, char *&out)
{
    //
    // Output a run of runCount instances of the symbol sCount.
    // Output the symbols explicitly, or if that is shorter, output
    // the sCode symbol once followed by a runCode symbol and runCount
    // expressed as an 8-bit number.
    //
    
    if (hufLength (sCode) + hufLength (runCode) + 8 <
        hufLength (sCode) * runCount)
    {
	outputCode (sCode, c, lc, out);
	outputCode (runCode, c, lc, out);
	outputBits (8, runCount, c, lc, out);
    }
    else
    {
	while (runCount-- >= 0)
	    outputCode (sCode, c, lc, out);
    }
}